

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O2

void __thiscall Guild::SetMemberRank(Guild *this,string *name,int rank)

{
  long lVar1;
  long *plVar2;
  __type _Var3;
  _List_node_base *p_Var4;
  long *plVar5;
  list<Client_*,_std::allocator<Client_*>_> *plVar6;
  shared_ptr<Guild_Member> member;
  string rank_str;
  undefined1 local_a8 [24];
  string local_90;
  string local_70 [32];
  Database_Result local_50;
  
  std::__cxx11::string::string((string *)(local_a8 + 0x38),(string *)name);
  GetMember((Guild *)local_a8,(string *)this);
  std::__cxx11::string::~string((string *)(local_a8 + 0x38));
  if ((element_type *)local_a8._0_8_ != (element_type *)0x0) {
    GetRank_abi_cxx11_((string *)(local_a8 + 0x18),this,rank);
    *(int *)&((string *)(local_a8._0_8_ + 0x18))->_M_string_length = rank;
    std::__cxx11::string::_M_assign
              ((string *)(((string *)(local_a8._0_8_ + 0x18))->field_2)._M_local_buf);
    local_a8._16_8_ = this->manager->world;
    plVar6 = &(((World *)local_a8._16_8_)->server->super_Server).clients;
    p_Var4 = (_List_node_base *)plVar6;
LAB_00193764:
    do {
      do {
        p_Var4 = (((_List_base<Client_*,_std::allocator<Client_*>_> *)&p_Var4->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next;
        if (p_Var4 == (_List_node_base *)plVar6) {
          Database::Query(&local_50,(Database *)(local_a8._16_8_ + 0x88),
                          "UPDATE `characters` SET `guild_rank` = #, `guild_rank_string` = \'$\' WHERE `name` = \'$\'"
                          ,(ulong)(uint)rank,local_90._M_dataplus._M_p,(name->_M_dataplus)._M_p);
          std::
          vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
          ::~vector(&local_50.
                     super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                   );
          goto LAB_001937fc;
        }
        lVar1 = *(long *)((long)p_Var4[1]._M_next + 0x108);
      } while (lVar1 == 0);
      plVar5 = *(long **)(lVar1 + 0x50);
      plVar2 = *(long **)(lVar1 + 0x58);
      do {
        if (plVar5 == plVar2) goto LAB_00193764;
        lVar1 = *plVar5;
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(lVar1 + 0x18),name);
        plVar5 = plVar5 + 1;
      } while (!_Var3);
      *(char *)(lVar1 + 0x408) = (char)rank;
      std::__cxx11::string::_M_assign((string *)(lVar1 + 0x410));
    } while (*(char *)(lVar1 + 0xc) == '\0');
LAB_001937fc:
    std::__cxx11::string::~string((string *)(local_a8 + 0x18));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
  return;
}

Assistant:

void Guild::SetMemberRank(std::string name, int rank)
{
	std::shared_ptr<Guild_Member> member = this->GetMember(name);

	if (member)
	{
		std::string rank_str = this->GetRank(rank);

		member->rank = rank;
		member->rank_string = rank_str;

		World* world = this->manager->world;

		UTIL_FOREACH(world->server->clients, client)
		{
			EOClient *eoclient = static_cast<EOClient *>(client);

			if (eoclient->player)
			{
				UTIL_FOREACH(eoclient->player->characters, character)
				{
					if (character->real_name == name)
					{
						character->guild_rank = rank;
						character->guild_rank_string = rank_str;
						
						if (character->online)
							return;
						else
							break;
					}
				}
			}
		}

		world->db.Query("UPDATE `characters` SET `guild_rank` = #, `guild_rank_string` = '$' WHERE `name` = '$'",
			rank, rank_str.c_str(), name.c_str());
	}
}